

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mttr(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx,int rd,int rt,int u,int sel,
             int h)

{
  TCGContext_conflict6 *tcg_ctx;
  uintptr_t o_1;
  TCGv_i64 t;
  TCGv_i32 pTVar1;
  TCGv_i32 arg4;
  uintptr_t o_3;
  TCGTemp *ts;
  int32_t iVar2;
  code *func;
  uintptr_t o;
  TCGv_i32 fp0;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGTemp *local_48;
  int local_34;
  
  local_34 = h;
  tcg_ctx = ctx->uc->tcg_ctx;
  iVar2 = env->CP0_VPEControl;
  t = tcg_temp_local_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,rt);
  if ((((env->CP0_VPEConf0 & 2) == 0) &&
      ((((env->active_tc).CP0_TCBind ^ env->tcs[(byte)iVar2].CP0_TCBind) & 0xfU) != 0)) ||
     ((byte)env->mvp->CP0_MVPConf0 < (byte)env->CP0_VPEControl)) goto LAB_0087a17d;
  if (u == 0) {
    switch(rd) {
    case 1:
      if (sel == 2) {
        local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_mttc0_vpeconf0_mips64el;
      }
      else {
        if (sel != 1) goto switchD_0087a1bc_default;
        local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_mttc0_vpecontrol_mips64el;
      }
      break;
    case 2:
      switch(sel) {
      case 1:
        local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_mttc0_tcstatus_mips64el;
        break;
      case 2:
        local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_mttc0_tcbind_mips64el;
        break;
      case 3:
        local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_mttc0_tcrestart_mips64el;
        break;
      case 4:
        local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_mttc0_tchalt_mips64el;
        break;
      case 5:
        local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_mttc0_tccontext_mips64el;
        break;
      case 6:
        local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_mttc0_tcschedule_mips64el;
        break;
      case 7:
        local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_mttc0_tcschefback_mips64el;
        break;
      default:
        rd = 2;
        goto LAB_0087a3bc;
      }
      break;
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xb:
    case 0xe:
switchD_0087a22a_caseD_3:
LAB_0087a3bc:
      gen_mtc0(ctx,t,rd,sel);
      goto LAB_0087a17d;
    case 10:
      if (sel != 0) {
        rd = 10;
        goto LAB_0087a3bc;
      }
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_mttc0_entryhi_mips64el;
      break;
    case 0xc:
      if (sel != 0) {
        rd = 0xc;
        goto LAB_0087a3bc;
      }
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_mttc0_status_mips64el;
      break;
    case 0xd:
      if (sel != 0) goto switchD_0087a1bc_default;
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_mttc0_cause_mips64el;
      break;
    case 0xf:
      if (sel != 1) goto switchD_0087a1bc_default;
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_mttc0_ebase_mips64el;
      break;
    default:
      if (rd != 0x17) goto switchD_0087a22a_caseD_3;
      if (sel != 0) {
        rd = 0x17;
        goto LAB_0087a3bc;
      }
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_mttc0_debug_mips64el;
    }
LAB_0087a726:
    local_50 = t + (long)&tcg_ctx->pool_cur;
    tcg_gen_callN_mips64el(tcg_ctx,func,(TCGTemp *)0x0,2,&local_58);
    goto LAB_0087a17d;
  }
  switch(sel) {
  case 0:
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx,rd);
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_50 = t + (long)&tcg_ctx->pool_cur;
    ts = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    local_48 = ts;
    tcg_gen_callN_mips64el(tcg_ctx,helper_mttgpr_mips64el,(TCGTemp *)0x0,3,&local_58);
    goto LAB_0087a61b;
  case 1:
    break;
  case 2:
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,pTVar1,t);
    if (local_34 == 0) {
      gen_store_fpr32(ctx,pTVar1,rd);
    }
    else {
      gen_store_fpr32h(ctx,pTVar1,rd);
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)&tcg_ctx->pool_cur));
    goto LAB_0087a17d;
  case 3:
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx,rd);
    arg4 = tcg_const_i32_mips64el(tcg_ctx,rt);
    gen_helper_ctc1(tcg_ctx,tcg_ctx->cpu_env,t,pTVar1,arg4);
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(arg4 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    (ctx->base).is_jmp = DISAS_TARGET_0;
    goto LAB_0087a17d;
  default:
switchD_0087a1bc_default:
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
    generate_exception_end(ctx,0x14);
    return;
  }
  switch(rd) {
  case 0:
    iVar2 = 0;
    break;
  case 1:
    iVar2 = 0;
    goto LAB_0087a5a7;
  case 2:
    iVar2 = 0;
    goto LAB_0087a5fb;
  default:
    goto switchD_0087a1bc_default;
  case 4:
    iVar2 = 1;
    break;
  case 5:
    iVar2 = 1;
    goto LAB_0087a5a7;
  case 6:
    iVar2 = 1;
    goto LAB_0087a5fb;
  case 8:
    iVar2 = 2;
    break;
  case 9:
    iVar2 = 2;
    goto LAB_0087a5a7;
  case 10:
    iVar2 = 2;
    goto LAB_0087a5fb;
  case 0xc:
    iVar2 = 3;
    break;
  case 0xd:
    iVar2 = 3;
LAB_0087a5a7:
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx,iVar2);
    gen_helper_mtthi(tcg_ctx,tcg_ctx->cpu_env,t,pTVar1);
    goto LAB_0087a618;
  case 0xe:
    iVar2 = 3;
LAB_0087a5fb:
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx,iVar2);
    gen_helper_mttacx(tcg_ctx,tcg_ctx->cpu_env,t,pTVar1);
    goto LAB_0087a618;
  case 0x10:
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    func = helper_mttdsp_mips64el;
    goto LAB_0087a726;
  }
  pTVar1 = tcg_const_i32_mips64el(tcg_ctx,iVar2);
  gen_helper_mttlo(tcg_ctx,tcg_ctx->cpu_env,t,pTVar1);
LAB_0087a618:
  ts = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
LAB_0087a61b:
  tcg_temp_free_internal_mips64el(tcg_ctx,ts);
LAB_0087a17d:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_mttr(CPUMIPSState *env, DisasContext *ctx, int rd, int rt,
                     int u, int sel, int h)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    TCGv t0 = tcg_temp_local_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, rt);
    if ((env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) == 0 &&
        ((env->tcs[other_tc].CP0_TCBind & (0xf << CP0TCBd_CurVPE)) !=
         (env->active_tc.CP0_TCBind & (0xf << CP0TCBd_CurVPE)))) {
        /* NOP */
        ;
    } else if ((env->CP0_VPEControl & (0xff << CP0VPECo_TargTC)) >
             (env->mvp->CP0_MVPConf0 & (0xff << CP0MVPC0_PTC))) {
        /* NOP */
        ;
    } else if (u == 0) {
        switch (rd) {
        case 1:
            switch (sel) {
            case 1:
                gen_helper_mttc0_vpecontrol(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 2:
                gen_helper_mttc0_vpeconf0(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 2:
            switch (sel) {
            case 1:
                gen_helper_mttc0_tcstatus(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 2:
                gen_helper_mttc0_tcbind(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 3:
                gen_helper_mttc0_tcrestart(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 4:
                gen_helper_mttc0_tchalt(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 5:
                gen_helper_mttc0_tccontext(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 6:
                gen_helper_mttc0_tcschedule(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 7:
                gen_helper_mttc0_tcschefback(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        case 10:
            switch (sel) {
            case 0:
                gen_helper_mttc0_entryhi(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        case 12:
            switch (sel) {
            case 0:
                gen_helper_mttc0_status(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        case 13:
            switch (sel) {
            case 0:
                gen_helper_mttc0_cause(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 15:
            switch (sel) {
            case 1:
                gen_helper_mttc0_ebase(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 23:
            switch (sel) {
            case 0:
                gen_helper_mttc0_debug(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        default:
            gen_mtc0(ctx, t0, rd, sel);
        }
    } else {
        switch (sel) {
        /* GPR registers. */
        case 0:
            gen_helper_0e1i(mttgpr, t0, rd);
            break;
        /* Auxiliary CPU registers */
        case 1:
            switch (rd) {
            case 0:
                gen_helper_0e1i(mttlo, t0, 0);
                break;
            case 1:
                gen_helper_0e1i(mtthi, t0, 0);
                break;
            case 2:
                gen_helper_0e1i(mttacx, t0, 0);
                break;
            case 4:
                gen_helper_0e1i(mttlo, t0, 1);
                break;
            case 5:
                gen_helper_0e1i(mtthi, t0, 1);
                break;
            case 6:
                gen_helper_0e1i(mttacx, t0, 1);
                break;
            case 8:
                gen_helper_0e1i(mttlo, t0, 2);
                break;
            case 9:
                gen_helper_0e1i(mtthi, t0, 2);
                break;
            case 10:
                gen_helper_0e1i(mttacx, t0, 2);
                break;
            case 12:
                gen_helper_0e1i(mttlo, t0, 3);
                break;
            case 13:
                gen_helper_0e1i(mtthi, t0, 3);
                break;
            case 14:
                gen_helper_0e1i(mttacx, t0, 3);
                break;
            case 16:
                gen_helper_mttdsp(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
            }
            break;
        /* Floating point (COP1). */
        case 2:
            /* XXX: For now we support only a single FPU context. */
            if (h == 0) {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
                gen_store_fpr32(ctx, fp0, rd);
                tcg_temp_free_i32(tcg_ctx, fp0);
            } else {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
                gen_store_fpr32h(ctx, fp0, rd);
                tcg_temp_free_i32(tcg_ctx, fp0);
            }
            break;
        case 3:
            /* XXX: For now we support only a single FPU context. */
            {
                TCGv_i32 fs_tmp = tcg_const_i32(tcg_ctx, rd);

                gen_helper_0e2i(ctc1, t0, fs_tmp, rt);
                tcg_temp_free_i32(tcg_ctx, fs_tmp);
            }
            /* Stop translation as we may have changed hflags */
            ctx->base.is_jmp = DISAS_STOP;
            break;
        /* COP2: Not implemented. */
        case 4:
        case 5:
            /* fall through */
        default:
            goto die;
        }
    }
    tcg_temp_free(tcg_ctx, t0);
    return;

die:
    tcg_temp_free(tcg_ctx, t0);
    LOG_DISAS("mttr (reg %d u %d sel %d h %d)\n", rd, u, sel, h);
    generate_exception_end(ctx, EXCP_RI);
}